

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

FIOBJ fiobj_ary_alloc(size_t capa)

{
  undefined1 *puVar1;
  int *piVar2;
  
  puVar1 = (undefined1 *)fio_malloc(0x28);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x29;
    *(undefined2 *)(puVar1 + 1) = 0;
    puVar1[3] = 0;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x20) = 0;
    if (capa != 0) {
      fio_ary_____require_on_top((fio_ary___s *)(puVar1 + 8),capa);
    }
    return (FIOBJ)puVar1;
  }
  perror("ERROR: fiobj array couldn\'t allocate memory");
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static inline FIOBJ fiobj_ary_alloc(size_t capa) {
  fiobj_ary_s *ary = fio_malloc(sizeof(*ary));
  if (!ary) {
    perror("ERROR: fiobj array couldn't allocate memory");
    exit(errno);
  }
  *ary = (fiobj_ary_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_ARRAY,
          },
  };
  if (capa)
    fio_ary_____require_on_top(&ary->ary, capa);
  return (FIOBJ)ary;
}